

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code.cxx
# Opt level: O2

int write_strings(char *sfile)

{
  char cVar1;
  Fl_Type *pFVar2;
  int iVar3;
  int iVar4;
  FILE *__stream;
  char *s;
  char *pcVar5;
  Fl_Type **ppFVar6;
  
  __stream = (FILE *)fl_fopen(sfile,"w");
  if (__stream != (FILE *)0x0) {
    if (i18n_type == 2) {
      fprintf(__stream,"$ generated by Fast Light User Interface Designer (fluid) version %.4f\n",
              0x3ff07c84b5dcc63f);
      fprintf(__stream,"$set %s\n",i18n_set);
      fputs("$quote \"\n",__stream);
      iVar3 = 1;
      ppFVar6 = &Fl_Type::first;
      while (pFVar2 = *ppFVar6, pFVar2 != (Fl_Type *)0x0) {
        iVar4 = (*pFVar2->_vptr_Fl_Type[0x17])(pFVar2);
        if (iVar4 != 0) {
          if (pFVar2->label_ != (char *)0x0) {
            fprintf(__stream,"%d \"",iVar3);
            for (pcVar5 = pFVar2->label_; cVar1 = *pcVar5, cVar1 != '\0'; pcVar5 = pcVar5 + 1) {
              if (((cVar1 < ' ') || (cVar1 == '\x7f')) || (cVar1 == '\"')) {
                fprintf(__stream,"\\%03o");
              }
              else {
                putc((int)cVar1,__stream);
              }
            }
            iVar3 = iVar3 + 1;
            fputs("\"\n",__stream);
          }
          if (pFVar2[1].user_data_type_ != (char *)0x0) {
            fprintf(__stream,"%d \"",iVar3);
            for (pcVar5 = pFVar2[1].user_data_type_; cVar1 = *pcVar5, cVar1 != '\0';
                pcVar5 = pcVar5 + 1) {
              if (((cVar1 < ' ') || (cVar1 == '\x7f')) || (cVar1 == '\"')) {
                fprintf(__stream,"\\%03o");
              }
              else {
                putc((int)cVar1,__stream);
              }
            }
            iVar3 = iVar3 + 1;
            fputs("\"\n",__stream);
          }
        }
        ppFVar6 = &pFVar2->next;
      }
    }
    else if (i18n_type == 1) {
      fprintf(__stream,"# generated by Fast Light User Interface Designer (fluid) version %.4f\n",
              0x3ff07c84b5dcc63f);
      ppFVar6 = &Fl_Type::first;
      while (pFVar2 = *ppFVar6, pFVar2 != (Fl_Type *)0x0) {
        iVar3 = (*pFVar2->_vptr_Fl_Type[0x17])(pFVar2);
        if (iVar3 != 0) {
          if (pFVar2->label_ != (char *)0x0) {
            fputs("msgid \"",__stream);
            for (pcVar5 = pFVar2->label_; cVar1 = *pcVar5, cVar1 != '\0'; pcVar5 = pcVar5 + 1) {
              if (((cVar1 < ' ') || (cVar1 == '\x7f')) || (cVar1 == '\"')) {
                fprintf(__stream,"\\%03o");
              }
              else {
                putc((int)cVar1,__stream);
              }
            }
            fputs("\"\n",__stream);
            fputs("msgstr \"",__stream);
            for (pcVar5 = pFVar2->label_; cVar1 = *pcVar5, cVar1 != '\0'; pcVar5 = pcVar5 + 1) {
              if (((cVar1 < ' ') || (cVar1 == '\x7f')) || (cVar1 == '\"')) {
                fprintf(__stream,"\\%03o");
              }
              else {
                putc((int)cVar1,__stream);
              }
            }
            fputs("\"\n",__stream);
          }
          if (pFVar2[1].user_data_type_ != (char *)0x0) {
            fputs("msgid \"",__stream);
            for (pcVar5 = pFVar2[1].user_data_type_; cVar1 = *pcVar5, cVar1 != '\0';
                pcVar5 = pcVar5 + 1) {
              if (((cVar1 < ' ') || (cVar1 == '\x7f')) || (cVar1 == '\"')) {
                fprintf(__stream,"\\%03o");
              }
              else {
                putc((int)cVar1,__stream);
              }
            }
            fputs("\"\n",__stream);
            fputs("msgstr \"",__stream);
            for (pcVar5 = pFVar2[1].user_data_type_; cVar1 = *pcVar5, cVar1 != '\0';
                pcVar5 = pcVar5 + 1) {
              if (((cVar1 < ' ') || (cVar1 == '\x7f')) || (cVar1 == '\"')) {
                fprintf(__stream,"\\%03o");
              }
              else {
                putc((int)cVar1,__stream);
              }
            }
            fputs("\"\n",__stream);
          }
        }
        ppFVar6 = &pFVar2->next;
      }
    }
    else if (i18n_type == 0) {
      fprintf(__stream,"# generated by Fast Light User Interface Designer (fluid) version %.4f\n",
              0x3ff07c84b5dcc63f);
      ppFVar6 = &Fl_Type::first;
      while (pFVar2 = *ppFVar6, pFVar2 != (Fl_Type *)0x0) {
        iVar3 = (*pFVar2->_vptr_Fl_Type[0x17])(pFVar2);
        if (iVar3 != 0) {
          pcVar5 = pFVar2->label_;
          if (pcVar5 != (char *)0x0) {
            for (; cVar1 = *pcVar5, cVar1 != '\0'; pcVar5 = pcVar5 + 1) {
              if (((cVar1 < ' ') || (cVar1 == '\x7f')) || (cVar1 == '\"')) {
                fprintf(__stream,"\\%03o");
              }
              else {
                putc((int)cVar1,__stream);
              }
            }
            putc(10,__stream);
          }
          pcVar5 = pFVar2[1].user_data_type_;
          if (pcVar5 != (char *)0x0) {
            for (; cVar1 = *pcVar5, cVar1 != '\0'; pcVar5 = pcVar5 + 1) {
              if (((cVar1 < ' ') || (cVar1 == '\x7f')) || (cVar1 == '\"')) {
                fprintf(__stream,"\\%03o");
              }
              else {
                putc((int)cVar1,__stream);
              }
            }
            putc(10,__stream);
          }
        }
        ppFVar6 = &pFVar2->next;
      }
    }
    iVar3 = fclose(__stream);
    return iVar3;
  }
  return 1;
}

Assistant:

int write_strings(const char *sfile) {
  FILE *fp = fl_fopen(sfile, "w");
  Fl_Type *p;
  Fl_Widget_Type *w;
  int i;

  if (!fp) return 1;

  switch (i18n_type) {
  case 0 : /* None, just put static text out */
      fprintf(fp, "# generated by Fast Light User Interface Designer (fluid) version %.4f\n",
	      FL_VERSION);
      for (p = Fl_Type::first; p; p = p->next) {
        if (p->is_widget()) {
	  w = (Fl_Widget_Type *)p;

	  if (w->label()) {
	    for (const char *s = w->label(); *s; s ++)
	      if (*s < 32 || *s > 126 || *s == '\"')
		fprintf(fp, "\\%03o", *s);
	      else
		putc(*s, fp);
            putc('\n', fp);
	  }

	  if (w->tooltip()) {
	    for (const char *s = w->tooltip(); *s; s ++)
	      if (*s < 32 || *s > 126 || *s == '\"')
		fprintf(fp, "\\%03o", *s);
	      else
		putc(*s, fp);
            putc('\n', fp);
	  }
	}
      }
      break;
  case 1 : /* GNU gettext, put a .po file out */
      fprintf(fp, "# generated by Fast Light User Interface Designer (fluid) version %.4f\n",
	      FL_VERSION);
      for (p = Fl_Type::first; p; p = p->next) {
        if (p->is_widget()) {
	  w = (Fl_Widget_Type *)p;

	  if (w->label()) {
	    const char *s;

	    fputs("msgid \"", fp);
	    for (s = w->label(); *s; s ++)
	      if (*s < 32 || *s > 126 || *s == '\"')
		fprintf(fp, "\\%03o", *s);
	      else
		putc(*s, fp);
            fputs("\"\n", fp);

	    fputs("msgstr \"", fp);
	    for (s = w->label(); *s; s ++)
	      if (*s < 32 || *s > 126 || *s == '\"')
		fprintf(fp, "\\%03o", *s);
	      else
		putc(*s, fp);
            fputs("\"\n", fp);
	  }

	  if (w->tooltip()) {
	    const char *s;

	    fputs("msgid \"", fp);
	    for (s = w->tooltip(); *s; s ++)
	      if (*s < 32 || *s > 126 || *s == '\"')
		fprintf(fp, "\\%03o", *s);
	      else
		putc(*s, fp);
            fputs("\"\n", fp);

	    fputs("msgstr \"", fp);
	    for (s = w->tooltip(); *s; s ++)
	      if (*s < 32 || *s > 126 || *s == '\"')
		fprintf(fp, "\\%03o", *s);
	      else
		putc(*s, fp);
            fputs("\"\n", fp);
	  }
	}
      }
      break;
  case 2 : /* POSIX catgets, put a .msg file out */
      fprintf(fp, "$ generated by Fast Light User Interface Designer (fluid) version %.4f\n",
	      FL_VERSION);
      fprintf(fp, "$set %s\n", i18n_set);
      fputs("$quote \"\n", fp);

      for (i = 1, p = Fl_Type::first; p; p = p->next) {
        if (p->is_widget()) {
	  w = (Fl_Widget_Type *)p;

	  if (w->label()) {
	    fprintf(fp, "%d \"", i ++);
	    for (const char *s = w->label(); *s; s ++)
	      if (*s < 32 || *s > 126 || *s == '\"')
		fprintf(fp, "\\%03o", *s);
	      else
		putc(*s, fp);
            fputs("\"\n", fp);
	  }

	  if (w->tooltip()) {
	    fprintf(fp, "%d \"", i ++);
	    for (const char *s = w->tooltip(); *s; s ++)
	      if (*s < 32 || *s > 126 || *s == '\"')
		fprintf(fp, "\\%03o", *s);
	      else
		putc(*s, fp);
            fputs("\"\n", fp);
	  }
	}
      }
      break;
  }

  return fclose(fp);
}